

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O2

void qclab::dense::operateInPlace<qclab::dense::SquareMatrix<double>>(Op op,SquareMatrix<double> *A)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  long lVar11;
  
  if (op != NoTrans) {
    lVar3 = A->size_;
    lVar6 = 1;
    if (1 < lVar3) {
      lVar6 = lVar3;
    }
    lVar8 = lVar3 * 8;
    lVar1 = lVar3 * 8 + 8;
    lVar7 = 0;
    lVar9 = 0;
    lVar5 = lVar3;
    while (lVar9 != lVar6 + -1) {
      lVar9 = lVar9 + 1;
      pdVar4 = (A->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      puVar10 = (undefined8 *)((long)pdVar4 + lVar8);
      for (lVar11 = 1; lVar5 != lVar11; lVar11 = lVar11 + 1) {
        uVar2 = *(undefined8 *)((long)pdVar4 + lVar11 * 8 + lVar7);
        *(undefined8 *)((long)pdVar4 + lVar11 * 8 + lVar7) = *puVar10;
        *puVar10 = uVar2;
        puVar10 = puVar10 + lVar3;
      }
      lVar5 = lVar5 + -1;
      lVar8 = lVar8 + lVar1;
      lVar7 = lVar7 + lVar1;
    }
  }
  return;
}

Assistant:

void operateInPlace( Op op , T& A ) {
      if ( op == Op::NoTrans ) return ;
      const int64_t rows = A.rows() ;
      const int64_t cols = A.cols() ;
      if constexpr ( qclab::is_complex_v< typename T::value_type > ) {
        if ( op == Op::ConjTrans ) {
          // conjugate
          #pragma omp parallel for
          for ( int64_t j = 0; j < cols; j++ ) {
            for ( int64_t i = 0; i < rows; i++ ) {
              A(i,j) = std::conj( A(i,j) ) ;
            }
          }
        }
      }
      // transpose
      #pragma omp parallel for
      for ( int64_t j = 0; j < cols - 1; j++ ) {
        for ( int64_t i = j + 1; i < rows; i++ ) {
          std::swap( A(i,j) , A(j,i) ) ;
        }
      }
    }